

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double english_letter_cdf(char c)

{
  int iVar1;
  undefined3 in_register_00000039;
  
  iVar1 = -0x60;
  if (0x19 < (byte)(c + 0x9fU)) {
    if (0x19 < (byte)(c + 0xbfU)) {
      return 0.0;
    }
    iVar1 = -0x40;
  }
  return english_letter_cdf::cdf_vec[(uint)(iVar1 + CONCAT31(in_register_00000039,c))];
}

Assistant:

double english_letter_cdf ( char c )

//*****************************************************************************/
//
//  Purpose:
//
//    ENGLISH_LETTER_CDF evaluates the English Letter CDF.
//
//  Discussion:
//
//    CDF('c') = 0.12441
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    06 March 2016
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Robert Lewand,
//    Cryptological Mathematics,
//    Mathematics Association of America, 2000,
//    ISBN13: 978-0883857199
//
//  Parameters:
//
//    Input, char C, the letter whose probability is desired.
//    'a' <= c <= 'z', but case is ignored.
//
//    Output, double ENGLISH_LETTER_CDF, the probability that a random letter is less
//    than or equal to C.
//
{
  double cdf;
  static double cdf_vec[27] = {
    0.00000, 
    0.08167, 0.09659, 0.12441, 0.16694, 0.29396, 
    0.31624, 0.33639, 0.39733, 0.46699, 0.46852, 
    0.47624, 0.51649, 0.54055, 0.60804, 0.68311, 
    0.70240, 0.70335, 0.76322, 0.82649, 0.91705, 
    0.94463, 0.95441, 0.97802, 0.97952, 0.99926, 
    1.00000 };
  int i;

  if ( 'a' <= c && c <= 'z' )
  {
    i = c - 'a' + 1;
    cdf = cdf_vec[i];
  }
  else if ( 'A' <= c && c <= 'Z' )
  {
    i = c - 'A' + 1;
    cdf = cdf_vec[i];
  }
  else
  {
    cdf = 0.0;
  }

  return cdf;
}